

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
SectionHdrWrapper::splitCharacteristics
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,DWORD charact
          )

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_> local_20;
  iterator iter;
  DWORD charact_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *chSet;
  
  iter._M_node._4_4_ = charact;
  sVar3 = std::
          map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::size(&s_secHdrCharact);
  if (sVar3 == 0) {
    initSecCharacter(&s_secHdrCharact);
  }
  iter._M_node._3_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::begin(&s_secHdrCharact);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
         ::end(&s_secHdrCharact);
    bVar2 = std::operator!=(&local_20,&local_30);
    uVar1 = iter._M_node._4_4_;
    if (!bVar2) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::operator->(&local_20);
    if ((uVar1 & ppVar4->first) != 0) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::operator->
                         (&local_20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&ppVar4->first);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_QString>_>::operator++(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DWORD> SectionHdrWrapper::splitCharacteristics(DWORD charact)
{
    if (s_secHdrCharact.size() == 0) {
        initSecCharacter(s_secHdrCharact);
    }
    std::vector<DWORD> chSet;
    std::map<DWORD, QString>::iterator iter;
    for (iter = s_secHdrCharact.begin(); iter != s_secHdrCharact.end(); ++iter) {
        if (charact & iter->first) {
            chSet.push_back(iter->first);
        }
    }
    return chSet;
}